

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O2

void Gia_ManTestDoms2(Gia_Man_t *p)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  abctime aVar4;
  abctime aVar5;
  Gia_Obj_t *pGVar6;
  Vec_Int_t *p_00;
  Gia_Obj_t *pNode;
  ulong uVar7;
  abctime time;
  ulong uVar8;
  int iVar9;
  
  aVar4 = Abc_Clock();
  if (p->vDoms != (Vec_Int_t *)0x0) {
    __assert_fail("p->vDoms == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absRpm.c"
                  ,0xc4,"void Gia_ManTestDoms2(Gia_Man_t *)");
  }
  Gia_ManComputeDoms(p);
  aVar5 = Abc_Clock();
  Abc_PrintTime(0x816bba,(char *)(aVar5 - aVar4),time);
  Gia_ManCleanMark1(p);
  iVar9 = 0;
  while ((iVar9 < p->vCis->nSize - p->nRegs &&
         (pGVar6 = Gia_ManCi(p,iVar9), pGVar6 != (Gia_Obj_t *)0x0))) {
    pGVar6->field_0x7 = pGVar6->field_0x7 | 0x40;
    iVar9 = iVar9 + 1;
  }
  p_00 = Vec_IntAlloc(100);
  Gia_ManCreateRefs(p);
  iVar9 = 0;
  do {
    if ((p->vCis->nSize - p->nRegs <= iVar9) ||
       (pGVar6 = Gia_ManCi(p,iVar9), pGVar6 == (Gia_Obj_t *)0x0)) {
      Vec_IntFree(p_00);
      Gia_ManCleanMark1(p);
      return;
    }
    iVar2 = Gia_ObjId(p,pGVar6);
    iVar3 = Gia_ObjDom(p,pGVar6);
    if (iVar2 != iVar3) {
      iVar2 = Gia_ObjDom(p,pGVar6);
      pNode = Gia_ManObj(p,iVar2);
      iVar2 = (int)*(ulong *)pNode;
      uVar7 = *(ulong *)pNode & 0x1fffffff;
      if (uVar7 == 0x1fffffff || -1 < iVar2) {
        if ((iVar2 < 0) || ((int)uVar7 == 0x1fffffff)) {
          __assert_fail("Gia_ObjIsAnd(pDom)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absRpm.c"
                        ,0xdd,"void Gia_ManTestDoms2(Gia_Man_t *)");
        }
        Abs_GiaObjDeref_rec(p,pNode);
        Abs_ManSupport2(p,pNode,p_00);
        Abs_GiaObjRef_rec(p,pNode);
        iVar2 = Gia_ObjId(p,pGVar6);
        uVar7 = (ulong)(uint)p_00->nSize;
        if (p_00->nSize < 1) {
          uVar7 = 0;
        }
        uVar8 = 0;
        do {
          if (uVar7 == uVar8) {
            puts("FAILURE.");
            break;
          }
          piVar1 = p_00->pArray + uVar8;
          uVar8 = uVar8 + 1;
        } while (*piVar1 != iVar2);
      }
      else if (pNode + -uVar7 != pGVar6) {
        __assert_fail("Gia_ObjFanin0(pDom) == pObj",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absRpm.c"
                      ,0xda,"void Gia_ManTestDoms2(Gia_Man_t *)");
      }
    }
    iVar9 = iVar9 + 1;
  } while( true );
}

Assistant:

void Gia_ManTestDoms2( Gia_Man_t * p )
{
    Vec_Int_t * vNodes;
    Gia_Obj_t * pObj, * pDom;
    abctime clk = Abc_Clock();
    int i;
    assert( p->vDoms == NULL );
    Gia_ManComputeDoms( p );
/*
    Gia_ManForEachPi( p, pObj, i )
        if ( Gia_ObjId(p, pObj) != Gia_ObjDom(p, pObj) )
            printf( "PI =%6d  Id =%8d. Dom =%8d.\n", i, Gia_ObjId(p, pObj), Gia_ObjDom(p, pObj) );
*/
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    // for each dominated PI, when if the PIs is in a leaf of the MFFC of the dominator
    Gia_ManCleanMark1( p );
    Gia_ManForEachPi( p, pObj, i )
        pObj->fMark1 = 1;
    vNodes = Vec_IntAlloc( 100 );
    Gia_ManCreateRefs( p );
    Gia_ManForEachPi( p, pObj, i )
    {
        if ( Gia_ObjId(p, pObj) == Gia_ObjDom(p, pObj) )
            continue;

        pDom = Gia_ManObj(p, Gia_ObjDom(p, pObj));
        if ( Gia_ObjIsCo(pDom) )
        {
            assert( Gia_ObjFanin0(pDom) == pObj );
            continue;
        }
        assert( Gia_ObjIsAnd(pDom) );
        Abs_GiaObjDeref_rec( p, pDom );
        Abs_ManSupport2( p, pDom, vNodes );
        Abs_GiaObjRef_rec( p, pDom );

        if ( Vec_IntFind(vNodes, Gia_ObjId(p, pObj)) == -1 )
            printf( "FAILURE.\n" );
//        else
//            printf( "Success.\n" );
    }
    Vec_IntFree( vNodes );
    Gia_ManCleanMark1( p );
}